

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
          (RuleBasedBreakIterator *this,UDataMemory *udm,UErrorCode *status)

{
  RBBIDataWrapper *this_00;
  UErrorCode *size;
  UnicodeString local_68;
  
  BreakIterator::BreakIterator(&this->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_0024c1c0;
  local_68.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00251160;
  local_68.fUnion.fStackFields.fLengthAndFlags = 2;
  StringCharacterIterator::StringCharacterIterator(&this->fSCharIter,&local_68);
  UnicodeString::~UnicodeString(&local_68);
  size = status;
  init(this,(EVP_PKEY_CTX *)status);
  this_00 = (RBBIDataWrapper *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
  if (this_00 == (RBBIDataWrapper *)0x0) {
    this->fData = (RBBIDataWrapper *)0x0;
    if ((this_00 == (RBBIDataWrapper *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  else {
    RBBIDataWrapper::RBBIDataWrapper(this_00,udm,status);
    this->fData = this_00;
  }
  return;
}

Assistant:

RuleBasedBreakIterator::RuleBasedBreakIterator(UDataMemory* udm, UErrorCode &status)
 : fSCharIter(UnicodeString())
{
    init(status);
    fData = new RBBIDataWrapper(udm, status); // status checked in constructor
    if (U_FAILURE(status)) {return;}
    if(fData == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
}